

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O0

ZoneState * __thiscall
QTimeZonePrivate::stateAtZoneTime
          (QTimeZonePrivate *this,qint64 forLocalMSecs,TransitionOptions resolve)

{
  long lVar1;
  int iVar2;
  undefined1 *puVar3;
  bool bVar4;
  byte bVar5;
  enable_if_t<std::is_signed_v<long_long>,_bool> eVar6;
  int iVar7;
  int iVar8;
  qint64 qVar9;
  undefined1 *puVar10;
  undefined1 *puVar11;
  long in_RDX;
  long *in_RSI;
  ZoneState *in_RDI;
  long in_FS_OFFSET;
  int dstStep;
  bool lateOk;
  bool earlyOk;
  qint64 forLate;
  qint64 forEarly;
  int late;
  int early;
  bool flipped;
  bool fallBack;
  qint64 nextStart;
  qint64 imminent;
  qint64 recent;
  qint64 utcEpochMSecs;
  qint64 millis;
  integral_constant<long_long,_61200000LL> seventeenHoursInMSecs;
  anon_class_1_0_00000001 dataToState;
  Data newTran;
  Data nextTran;
  Data tran;
  Data data;
  Data future;
  Data past;
  undefined4 in_stack_fffffffffffffcf8;
  TransitionOption in_stack_fffffffffffffcfc;
  int in_stack_fffffffffffffd00;
  int in_stack_fffffffffffffd04;
  bool local_249;
  undefined1 *local_210;
  undefined1 *local_208;
  int local_1b0;
  undefined1 *local_170;
  undefined1 *local_168;
  undefined1 local_15e;
  undefined1 local_15d;
  undefined1 local_158 [48];
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  int local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined1 *puStack_e0;
  int local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  int local_48;
  int iStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  int local_18;
  int iStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_15d = 0xaa;
  local_15e = 0xaa;
  local_168 = &DAT_aaaaaaaaaaaaaaaa;
  bVar4 = qSubOverflow<long_long,_61200000LL>(in_RDX,&local_168);
  puVar3 = local_168;
  if ((bVar4) || (qVar9 = minMSecs(), (long)puVar3 < qVar9)) {
    local_208 = (undefined1 *)minMSecs();
  }
  else {
    local_208 = local_168;
  }
  bVar4 = qAddOverflow<long_long,_61200000LL>(in_RDX,&local_168);
  if (bVar4) {
    local_210 = (undefined1 *)maxMSecs();
  }
  else {
    local_210 = local_168;
  }
  local_18 = -0x55555556;
  iStack_14 = -0x55555556;
  uStack_10 = 0xaaaaaaaa;
  uStack_c = 0xaaaaaaaa;
  local_28 = 0xaaaaaaaa;
  uStack_24 = 0xaaaaaaaa;
  uStack_20 = 0xaaaaaaaa;
  uStack_1c = 0xaaaaaaaa;
  local_38 = 0xaaaaaaaa;
  uStack_34 = 0xaaaaaaaa;
  uStack_30 = 0xaaaaaaaa;
  uStack_2c = 0xaaaaaaaa;
  (**(code **)(*in_RSI + 0x68))(&local_38,in_RSI,local_208);
  local_48 = -0x55555556;
  iStack_44 = -0x55555556;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  local_68 = 0xaaaaaaaa;
  uStack_64 = 0xaaaaaaaa;
  uStack_60 = 0xaaaaaaaa;
  uStack_5c = 0xaaaaaaaa;
  (**(code **)(*in_RSI + 0x68))(&local_68,in_RSI,local_210);
  lVar1 = CONCAT44(uStack_4c,uStack_50);
  qVar9 = invalidMSecs();
  if ((lVar1 == qVar9) &&
     (lVar1 = CONCAT44(uStack_1c,uStack_20), qVar9 = invalidMSecs(), lVar1 == qVar9)) {
    QDateTimePrivate::ZoneState::ZoneState(in_RDI,in_RDX);
    goto LAB_007399e3;
  }
  local_249 = false;
  if ((local_18 == local_48) && (local_249 = false, iStack_14 == iStack_44)) {
    local_249 = ::operator==((QString *)
                             CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                             (QString *)
                             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  }
  if (local_249 != false) {
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    Data::Data((Data *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
               (Data *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    puStack_80 = (undefined1 *)(in_RDX - local_48 * 1000);
    stateAtZoneTime::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)
               CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
               (Data *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    Data::~Data((Data *)0x738f16);
    goto LAB_007399e3;
  }
  bVar5 = (**(code **)(*in_RSI + 0x80))();
  if ((bVar5 & 1) != 0) {
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
    local_c8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
    Data::Data((Data *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
               (Data *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    local_d8 = -0x55555556;
    uStack_d4 = 0xaaaaaaaa;
    uStack_d0 = 0xaaaaaaaa;
    uStack_cc = 0xaaaaaaaa;
    local_e8 = 0xaaaaaaaa;
    uStack_e4 = 0xaaaaaaaa;
    puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
    local_f8 = 0xaaaaaaaa;
    uStack_f4 = 0xaaaaaaaa;
    uStack_f0 = 0xaaaaaaaa;
    uStack_ec = 0xaaaaaaaa;
    (**(code **)(*in_RSI + 0x88))(&local_f8,in_RSI,puStack_b0);
    do {
      puVar3 = puStack_e0;
      puVar10 = (undefined1 *)invalidMSecs();
      if (puVar3 == puVar10 || in_RDX <= (long)(puStack_e0 + local_d8 * 1000)) break;
      local_108 = -0x55555556;
      uStack_104 = 0xaaaaaaaa;
      uStack_100 = 0xaaaaaaaa;
      uStack_fc = 0xaaaaaaaa;
      local_118 = 0xaaaaaaaa;
      uStack_114 = 0xaaaaaaaa;
      uStack_110 = 0xaaaaaaaa;
      uStack_10c = 0xaaaaaaaa;
      local_128 = 0xaaaaaaaa;
      uStack_124 = 0xaaaaaaaa;
      uStack_120 = 0xaaaaaaaa;
      uStack_11c = 0xaaaaaaaa;
      (**(code **)(*in_RSI + 0x88))(&local_128,in_RSI,puStack_e0);
      lVar1 = CONCAT44(uStack_10c,uStack_110);
      qVar9 = invalidMSecs();
      if ((lVar1 == qVar9) ||
         ((long)local_210 < CONCAT44(uStack_10c,uStack_110) + (long)(local_108 * 1000))) {
        local_1b0 = 3;
      }
      else {
        Data::operator=((Data *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                        (Data *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        Data::operator=((Data *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                        (Data *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        local_1b0 = 0;
      }
      Data::~Data((Data *)0x7391ae);
    } while (local_1b0 == 0);
    puVar10 = puStack_b0;
    puVar3 = puStack_e0;
    puVar11 = (undefined1 *)invalidMSecs();
    if (puVar10 == puVar11) {
LAB_0073928a:
      puVar10 = puStack_b0;
      puVar11 = (undefined1 *)invalidMSecs();
      if ((puVar10 == puVar11) || (puVar10 = (undefined1 *)invalidMSecs(), puVar3 == puVar10)) {
        bVar4 = false;
      }
      else {
        puStack_e0 = (undefined1 *)(in_RDX - local_d8 * 1000);
        bVar4 = false;
        if ((long)puStack_e0 < (long)puVar3) {
          if ((long)puStack_b0 < (long)puVar3) {
            stateAtZoneTime::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)
                       CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                       (Data *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
            bVar4 = true;
          }
          else {
LAB_007393ab:
            QFlags<QDateTimePrivate::TransitionOption>::testFlag
                      ((QFlags<QDateTimePrivate::TransitionOption> *)
                       CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                       in_stack_fffffffffffffcfc);
            if (bVar4) {
              bVar4 = QFlags<QDateTimePrivate::TransitionOption>::testFlag
                                ((QFlags<QDateTimePrivate::TransitionOption> *)
                                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                                 in_stack_fffffffffffffcfc);
              if (bVar4) {
                stateAtZoneTime::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)
                           CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                           (Data *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
                bVar4 = true;
              }
              else {
                bVar4 = QFlags<QDateTimePrivate::TransitionOption>::testFlag
                                  ((QFlags<QDateTimePrivate::TransitionOption> *)
                                   CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                                   in_stack_fffffffffffffcfc);
                if (bVar4) {
                  stateAtZoneTime::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)
                             CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                             (Data *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
                  bVar4 = true;
                }
                else {
LAB_007395d0:
                  QDateTimePrivate::ZoneState::ZoneState(in_RDI,in_RDX);
                  bVar4 = true;
                }
              }
            }
            else {
              std::swap<long_long>((longlong *)&puStack_b0,(longlong *)&puStack_e0);
              bVar4 = QFlags<QDateTimePrivate::TransitionOption>::testFlag
                                ((QFlags<QDateTimePrivate::TransitionOption> *)
                                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                                 in_stack_fffffffffffffcfc);
              if (bVar4) {
                stateAtZoneTime::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)
                           CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                           (Data *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
                bVar4 = true;
              }
              else {
                bVar4 = QFlags<QDateTimePrivate::TransitionOption>::testFlag
                                  ((QFlags<QDateTimePrivate::TransitionOption> *)
                                   CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                                   in_stack_fffffffffffffcfc);
                if (!bVar4) goto LAB_007395d0;
                stateAtZoneTime::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)
                           CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                           (Data *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
                bVar4 = true;
              }
            }
          }
        }
        else {
          if ((long)puStack_b0 < (long)puVar3) {
            bVar4 = true;
            goto LAB_007393ab;
          }
          stateAtZoneTime::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)
                     CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                     (Data *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          bVar4 = true;
        }
      }
    }
    else {
      puStack_b0 = (undefined1 *)(in_RDX - (int)local_a8 * 1000);
      puVar10 = (undefined1 *)invalidMSecs();
      if ((puVar3 != puVar10) || ((int)local_a8 != local_48)) goto LAB_0073928a;
      stateAtZoneTime::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                 (Data *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      bVar4 = true;
    }
    Data::~Data((Data *)0x73960c);
    Data::~Data((Data *)0x739619);
    if (bVar4) goto LAB_007399e3;
  }
  iVar2 = local_18;
  iVar8 = local_48;
  local_170 = &DAT_aaaaaaaaaaaaaaaa;
  if ((local_18 == local_48) || (iVar7 = invalidSeconds(), iVar8 == iVar7)) {
    iVar8 = invalidSeconds();
    if ((iVar2 == iVar8) ||
       (eVar6 = qSubOverflow<long_long>(in_RDX,(long)iVar2 * 1000,(longlong *)&local_170),
       puVar3 = local_170, eVar6)) {
      QDateTimePrivate::ZoneState::ZoneState(in_RDI,in_RDX);
      goto LAB_007399e3;
    }
  }
  else {
    puVar10 = (undefined1 *)(in_RDX - iVar2 * 1000);
    puVar11 = (undefined1 *)(in_RDX - iVar8 * 1000);
    in_stack_fffffffffffffd04 = (**(code **)(*in_RSI + 0x40))(in_RSI,puVar10);
    bVar4 = in_stack_fffffffffffffd04 == iVar2;
    in_stack_fffffffffffffd00 = (**(code **)(*in_RSI + 0x40))(in_RSI,puVar11);
    if (bVar4) {
      puVar3 = puVar10;
      if (((in_stack_fffffffffffffd00 == iVar8) &&
          (bVar4 = QFlags<QDateTimePrivate::TransitionOption>::testFlag
                             ((QFlags<QDateTimePrivate::TransitionOption> *)
                              CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                              in_stack_fffffffffffffcfc), !bVar4)) &&
         (bVar4 = QFlags<QDateTimePrivate::TransitionOption>::testFlag
                            ((QFlags<QDateTimePrivate::TransitionOption> *)
                             CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                             in_stack_fffffffffffffcfc), puVar3 = puVar11, !bVar4)) {
        QDateTimePrivate::ZoneState::ZoneState(in_RDI,in_RDX);
        goto LAB_007399e3;
      }
    }
    else {
      puVar3 = puVar11;
      if (in_stack_fffffffffffffd00 != iVar8) {
        iVar8 = (iVar8 - iVar2) * 1000;
        bVar4 = QFlags<QDateTimePrivate::TransitionOption>::testFlag
                          ((QFlags<QDateTimePrivate::TransitionOption> *)
                           CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                           in_stack_fffffffffffffcfc);
        if (bVar4) {
          puVar3 = puVar10 + -(long)iVar8;
        }
        else {
          bVar4 = QFlags<QDateTimePrivate::TransitionOption>::testFlag
                            ((QFlags<QDateTimePrivate::TransitionOption> *)
                             CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                             in_stack_fffffffffffffcfc);
          if (!bVar4) {
            QDateTimePrivate::ZoneState::ZoneState(in_RDI,in_RDX);
            goto LAB_007399e3;
          }
          puVar3 = puVar11 + iVar8;
        }
      }
    }
  }
  local_170 = puVar3;
  (**(code **)(*in_RSI + 0x68))(local_158,in_RSI,local_170);
  stateAtZoneTime::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
             (Data *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  Data::~Data((Data *)0x7399af);
LAB_007399e3:
  Data::~Data((Data *)0x7399f0);
  Data::~Data((Data *)0x7399fd);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDateTimePrivate::ZoneState QTimeZonePrivate::stateAtZoneTime(
    qint64 forLocalMSecs, QDateTimePrivate::TransitionOptions resolve) const
{
    auto dataToState = [](const Data &d) {
        return QDateTimePrivate::ZoneState(d.atMSecsSinceEpoch + d.offsetFromUtc * 1000,
                                           d.offsetFromUtc,
                                           d.daylightTimeOffset ? QDateTimePrivate::DaylightTime
                                                                : QDateTimePrivate::StandardTime);
    };

    /*
      We need a UTC time at which to ask for the offset, in order to be able to
      add that offset to forLocalMSecs, to get the UTC time we need.
      Fortunately, all time-zone offsets have been less than 17 hours; and DST
      transitions happen (much) more than thirty-four hours apart. So sampling
      offset seventeen hours each side gives us information we can be sure
      brackets the correct time and at most one DST transition.
    */
    std::integral_constant<qint64, 17 * 3600 * 1000> seventeenHoursInMSecs;
    static_assert(-seventeenHoursInMSecs / 1000 < QTimeZone::MinUtcOffsetSecs
                  && seventeenHoursInMSecs / 1000 > QTimeZone::MaxUtcOffsetSecs);
    qint64 millis;
    // Clip the bracketing times to the bounds of the supported range.
    const qint64 recent =
        qSubOverflow(forLocalMSecs, seventeenHoursInMSecs, &millis) || millis < minMSecs()
        ? minMSecs() : millis; // Necessarily <= forLocalMSecs + 1.
    // (Given that minMSecs() is std::numeric_limits<qint64>::min() + 1.)
    const qint64 imminent =
        qAddOverflow(forLocalMSecs, seventeenHoursInMSecs, &millis)
        ? maxMSecs() : millis; // Necessarily >= forLocalMSecs
    // At most one of those was clipped to its boundary value:
    Q_ASSERT(recent < imminent && seventeenHoursInMSecs < imminent - recent + 1);

    const Data past = data(recent), future = data(imminent);
    if (future.atMSecsSinceEpoch == invalidMSecs()
        && past.atMSecsSinceEpoch == invalidMSecs()) {
        // Failed to get any useful data near this time: apparently out of range
        // for the backend.
        return { forLocalMSecs };
    }
    // > 99% of the time, past and future will agree:
    if (Q_LIKELY(past.offsetFromUtc == future.offsetFromUtc
                 && past.standardTimeOffset == future.standardTimeOffset
                 // Those two imply same daylightTimeOffset.
                 && past.abbreviation == future.abbreviation)) {
        Data data = future;
        data.atMSecsSinceEpoch = forLocalMSecs - future.offsetFromUtc * 1000;
        return dataToState(data);
    }

    /*
      Offsets are Local - UTC, positive to the east of Greenwich, negative to
      the west; DST offset normally exceeds standard offset, when DST applies.
      When we have offsets on either side of a transition, the lower one is
      standard, the higher is DST, unless we have data telling us it's the other
      way round.

      Non-DST transitions (jurisdictions changing time-zone and time-zones
      changing their standard offset, typically) are described below as if they
      were DST transitions (since these are more usual and familiar); the code
      mostly concerns itself with offsets from UTC, described in terms of the
      common case for changes in that.  If there is no actual change in offset
      (e.g. a DST transition cancelled by a standard offset change), this code
      should handle it gracefully; without transitions, it'll see early == late
      and take the easy path; with transitions, tran and nextTran get the
      correct UTC time as atMSecsSinceEpoch so comparing to nextStart selects
      the right one.  In all other cases, the transition changes offset and the
      reasoning that applies to DST applies just the same.

      The resolution of transitions, specified by \a resolve, may be lead astray
      if (as happens on Windows) the backend has been obliged to guess whether a
      transition is in fact a DST one or a change to standard offset; or to
      guess that the higher-offset side is the DST one (the reverse of this is
      true for Ireland, using negative DST). There's not much we can do about
      that, though.
    */
    if (hasTransitions()) {
        /*
          We have transitions.

          Each transition gives the offsets to use until the next; so we need
          the most recent transition before the time forLocalMSecs describes. If
          it describes a time *in* a transition, we'll need both that transition
          and the one before it. So find one transition that's probably after
          (and not much before, otherwise) and another that's definitely before,
          then work out which one to use. When both or neither work on
          forLocalMSecs, use resolve to disambiguate.
        */

        // Get a transition definitely before the local MSecs; usually all we need.
        // Only around the transition times might we need another.
        Data tran = past; // Data after last transition before our window.
        Q_ASSERT(forLocalMSecs < 0 || // Pre-epoch TZ info may be unavailable
                 forLocalMSecs - tran.offsetFromUtc * 1000 >= tran.atMSecsSinceEpoch);
        // If offset actually exceeds 17 hours, that assert may trigger.
        Data nextTran = nextTransition(tran.atMSecsSinceEpoch);
        /*
          Now walk those forward until they bracket forLocalMSecs with transitions.

          One of the transitions should then be telling us the right offset to use.
          In a transition, we need the transition before it (to describe the run-up
          to the transition) and the transition itself; so we need to stop when
          nextTran is (invalid or) that transition.
        */
        while (nextTran.atMSecsSinceEpoch != invalidMSecs()
               && forLocalMSecs > nextTran.atMSecsSinceEpoch + nextTran.offsetFromUtc * 1000) {
            Data newTran = nextTransition(nextTran.atMSecsSinceEpoch);
            if (newTran.atMSecsSinceEpoch == invalidMSecs()
                || newTran.atMSecsSinceEpoch + newTran.offsetFromUtc * 1000 > imminent) {
                // Definitely not a relevant tansition: too far in the future.
                break;
            }
            tran = nextTran;
            nextTran = newTran;
        }
        const qint64 nextStart = nextTran.atMSecsSinceEpoch;

        // Check we do *really* have transitions for this zone:
        if (tran.atMSecsSinceEpoch != invalidMSecs()) {
            /* So now tran is definitely before ... */
            Q_ASSERT(forLocalMSecs < 0
                     || forLocalMSecs - tran.offsetFromUtc * 1000 > tran.atMSecsSinceEpoch);
            // Work out the UTC value it would make sense to return if using tran:
            tran.atMSecsSinceEpoch = forLocalMSecs - tran.offsetFromUtc * 1000;

            // If there are no transition after it, the answer is easy - or
            // should be - but Darwin's handling of the distant future (in macOS
            // 15, QTBUG-126391) runs out of transitions in 506'712 CE, despite
            // knowing about offset changes long after that. So only trust the
            // easy answer if offsets match; otherwise, fall through to the
            // transitions-unknown code.
            if (nextStart == invalidMSecs() && tran.offsetFromUtc == future.offsetFromUtc)
                return dataToState(tran); // Last valid transition.
        }

        if (tran.atMSecsSinceEpoch != invalidMSecs() && nextStart != invalidMSecs()) {
            /*
              ... and nextTran is either after or only slightly before. We're
              going to interpret one as standard time, the other as DST
              (although the transition might in fact be a change in standard
              offset, or a change in DST offset, e.g. to/from double-DST).

              Usually exactly one of those shall be relevant and we'll use it;
              but if we're close to nextTran we may be in a transition, to be
              settled according to resolve's rules.
            */
            // Work out the UTC value it would make sense to return if using nextTran:
            nextTran.atMSecsSinceEpoch = forLocalMSecs - nextTran.offsetFromUtc * 1000;

            bool fallBack = false;
            if (nextStart > nextTran.atMSecsSinceEpoch) {
                // If both UTC values are before nextTran's offset applies, use tran:
                if (nextStart > tran.atMSecsSinceEpoch)
                    return dataToState(tran);

                Q_ASSERT(tran.offsetFromUtc < nextTran.offsetFromUtc);
                // We're in a spring-forward.
            } else if (nextStart <= tran.atMSecsSinceEpoch) {
                // Both UTC values say we should be using nextTran:
                return dataToState(nextTran);
            } else {
                Q_ASSERT(nextTran.offsetFromUtc < tran.offsetFromUtc);
                fallBack = true; // We're in a fall-back.
            }
            // (forLocalMSecs - nextStart) / 1000 lies between the two offsets.

            // Apply resolve:
            // Determine whether FlipForReverseDst affects the outcome:
            const bool flipped
                = resolve.testFlag(QDateTimePrivate::FlipForReverseDst)
                && (fallBack ? !tran.daylightTimeOffset && nextTran.daylightTimeOffset
                             : tran.daylightTimeOffset && !nextTran.daylightTimeOffset);

            if (fallBack) {
                if (resolve.testFlag(flipped
                                     ? QDateTimePrivate::FoldUseBefore
                                     : QDateTimePrivate::FoldUseAfter)) {
                    return dataToState(nextTran);
                }
                if (resolve.testFlag(flipped
                                     ? QDateTimePrivate::FoldUseAfter
                                     : QDateTimePrivate::FoldUseBefore)) {
                    return dataToState(tran);
                }
            } else {
                /* Neither is valid (e.g. in a spring-forward's gap) and
                   nextTran.atMSecsSinceEpoch < nextStart <= tran.atMSecsSinceEpoch.
                   So swap their atMSecsSinceEpoch to give each a moment on the
                   side of the transition that it describes, then select the one
                   after or before according to the option set:
                */
                std::swap(tran.atMSecsSinceEpoch, nextTran.atMSecsSinceEpoch);
                if (resolve.testFlag(flipped
                                     ? QDateTimePrivate::GapUseBefore
                                     : QDateTimePrivate::GapUseAfter))
                    return dataToState(nextTran);
                if (resolve.testFlag(flipped
                                     ? QDateTimePrivate::GapUseAfter
                                     : QDateTimePrivate::GapUseBefore))
                    return dataToState(tran);
            }
            // Reject
            return {forLocalMSecs};
        }
        // Before first transition, or system has transitions but not for this zone.
        // Try falling back to offsetFromUtc (works for before first transition, at least).
    }

    /* Bracket and refine to discover offset. */
    qint64 utcEpochMSecs;

    // We don't have true data on DST-ness, so can't apply FlipForReverseDst.
    int early = past.offsetFromUtc;
    int late = future.offsetFromUtc;
    if (early == late || late == invalidSeconds()) {
        if (early == invalidSeconds()
            || qSubOverflow(forLocalMSecs, early * qint64(1000), &utcEpochMSecs)) {
            return {forLocalMSecs}; // Outside representable range
        }
    } else {
        // Candidate values for utcEpochMSecs (if forLocalMSecs is valid):
        const qint64 forEarly = forLocalMSecs - early * 1000;
        const qint64 forLate = forLocalMSecs - late * 1000;
        // If either of those doesn't have the offset we got it from, it's on
        // the wrong side of the transition (and both may be, for a gap):
        const bool earlyOk = offsetFromUtc(forEarly) == early;
        const bool lateOk = offsetFromUtc(forLate) == late;

        if (earlyOk) {
            if (lateOk) {
                Q_ASSERT(early > late);
                // fall-back's repeated interval
                if (resolve.testFlag(QDateTimePrivate::FoldUseBefore))
                    utcEpochMSecs = forEarly;
                else if (resolve.testFlag(QDateTimePrivate::FoldUseAfter))
                    utcEpochMSecs = forLate;
                else
                    return {forLocalMSecs};
            } else {
                // Before and clear of the transition:
                utcEpochMSecs = forEarly;
            }
        } else if (lateOk) {
            // After and clear of the transition:
            utcEpochMSecs = forLate;
        } else {
            // forLate <= gap < forEarly
            Q_ASSERT(late > early);
            const int dstStep = (late - early) * 1000;
            if (resolve.testFlag(QDateTimePrivate::GapUseBefore))
                utcEpochMSecs = forEarly - dstStep;
            else if (resolve.testFlag(QDateTimePrivate::GapUseAfter))
                utcEpochMSecs = forLate + dstStep;
            else
                return {forLocalMSecs};
        }
    }

    return dataToState(data(utcEpochMSecs));
}